

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::SetRepeatCount(CommandLineArguments *this,int ac,char **av,int *i)

{
  int iVar1;
  size_t sVar2;
  int *in_RCX;
  int in_ESI;
  SimpleString *in_RDI;
  SimpleString repeatParameter;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  *(undefined4 *)&in_RDI[4].buffer_ = 0;
  SimpleString::SimpleString
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  sVar2 = SimpleString::size((SimpleString *)0x21c612);
  if (sVar2 < 3) {
    if (*in_RCX + 1 < in_ESI) {
      iVar1 = SimpleString::AtoI((char *)in_RDI);
      *(int *)&in_RDI[4].buffer_ = iVar1;
      if (*(int *)&in_RDI[4].buffer_ != 0) {
        *in_RCX = *in_RCX + 1;
      }
    }
  }
  else {
    iVar1 = SimpleString::AtoI((char *)in_RDI);
    *(int *)&in_RDI[4].buffer_ = iVar1;
  }
  if (*(int *)&in_RDI[4].buffer_ == 0) {
    *(undefined4 *)&in_RDI[4].buffer_ = 2;
  }
  SimpleString::~SimpleString((SimpleString *)0x21c6db);
  return;
}

Assistant:

void CommandLineArguments::SetRepeatCount(int ac, const char** av, int& i)
{
    repeat_ = 0;

    SimpleString repeatParameter(av[i]);
    if (repeatParameter.size() > 2) repeat_ = SimpleString::AtoI(av[i] + 2);
    else if (i + 1 < ac) {
        repeat_ = SimpleString::AtoI(av[i + 1]);
        if (repeat_ != 0) i++;
    }

    if (0 == repeat_) repeat_ = 2;

}